

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::CmpHelperEQ<pbrt::SquareMatrix<4>,pbrt::SquareMatrix<4>>
          (internal *this,char *expected_expression,char *actual_expression,
          SquareMatrix<4> *expected,SquareMatrix<4> *actual)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  long lVar4;
  long lVar5;
  Float *pFVar6;
  SquareMatrix<4> *value;
  SquareMatrix<4> *value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  Float *pFVar8;
  ulong uVar9;
  ulong uVar10;
  AssertionResult AVar11;
  string local_60;
  string local_40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar7
  ;
  
  fVar2 = expected->m[0][0];
  fVar3 = actual->m[0][0];
  value = (SquareMatrix<4> *)actual_expression;
  if ((fVar2 == fVar3) && (!NAN(fVar2) && !NAN(fVar3))) {
    pFVar6 = expected->m[0] + 1;
    pFVar8 = actual->m[0] + 1;
    value = (SquareMatrix<4> *)0x0;
    uVar9 = 0;
    while( true ) {
      uVar10 = 0xffffffffffffffff;
      do {
        if (uVar10 == 2) goto LAB_002b7ff9;
        lVar4 = uVar10 + 1;
        uVar1 = uVar10 + 1;
        lVar5 = uVar10 + 1;
      } while ((pFVar6[lVar4] == pFVar8[lVar5]) &&
              (uVar10 = uVar1, !NAN(pFVar6[lVar4]) && !NAN(pFVar8[lVar5])));
      if (uVar1 < 3) break;
LAB_002b7ff9:
      value = (SquareMatrix<4> *)(ulong)(2 < uVar9);
      if (uVar9 + 1 == 4) break;
      fVar2 = expected->m[uVar9 + 1][0];
      pFVar6 = pFVar6 + 4;
      pFVar8 = pFVar8 + 4;
      fVar3 = actual->m[uVar9 + 1][0];
      if ((fVar2 != fVar3) || (uVar9 = uVar9 + 1, NAN(fVar2) || NAN(fVar3))) break;
    }
    if (value != (SquareMatrix<4> *)0x0) {
      AVar11 = AssertionSuccess();
      sVar7 = AVar11.message_.ptr_;
      goto LAB_002b80a2;
    }
  }
  PrintToString<pbrt::SquareMatrix<4>>(&local_40,(testing *)expected,value);
  PrintToString<pbrt::SquareMatrix<4>>(&local_60,(testing *)actual,value_00);
  AVar11 = EqFailure(this,expected_expression,actual_expression,&local_40,&local_60,false);
  sVar7 = AVar11.message_.ptr_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    sVar7.ptr_ = extraout_RDX;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    sVar7.ptr_ = extraout_RDX_00;
  }
LAB_002b80a2:
  AVar11.message_.ptr_ = sVar7.ptr_;
  AVar11._0_8_ = this;
  return AVar11;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}